

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O1

void * slab_map(slab_arena *arena)

{
  size_t *psVar1;
  size_t sVar2;
  uint uVar3;
  void *pvVar4;
  quota *pqVar5;
  void *pvVar6;
  void *__e;
  uint uVar7;
  ulong *puVar8;
  char cVar9;
  ulong uVar10;
  ulong *unaff_R14;
  bool bVar11;
  
  do {
    pvVar4 = (arena->cache).next;
    puVar8 = (ulong *)((ulong)pvVar4 & 0xffffffffffff0000);
    if (puVar8 == (ulong *)0x0) {
      bVar11 = false;
      unaff_R14 = (ulong *)0x0;
    }
    else {
      LOCK();
      pvVar6 = (arena->cache).next;
      if (pvVar4 == pvVar6) {
        (arena->cache).next = (void *)((ulong)pvVar4 & 0xffff | *puVar8 & 0xffffffffffff0000);
        pvVar6 = pvVar4;
      }
      UNLOCK();
      bVar11 = pvVar4 != pvVar6;
      if (!bVar11) {
        unaff_R14 = puVar8;
      }
    }
  } while (bVar11);
  if (unaff_R14 == (ulong *)0x0) {
    uVar3 = arena->slab_size;
    if ((ulong)uVar3 == 0) {
      __assert_fail("size_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0x89,"ssize_t quota_use(struct quota *, size_t)");
    }
    pqVar5 = arena->quota;
    do {
      uVar10 = pqVar5->value;
      uVar7 = (uint)uVar10 + (int)((ulong)uVar3 + 0x3ff >> 10);
      if (uVar7 <= (uint)uVar10) {
        __assert_fail("new_used_in_units > used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0x90,"ssize_t quota_use(struct quota *, size_t)");
      }
      cVar9 = '\x01';
      if (uVar7 <= (uint)(uVar10 >> 0x20)) {
        LOCK();
        bVar11 = uVar10 == pqVar5->value;
        if (bVar11) {
          pqVar5->value = (ulong)uVar7 | uVar10 & 0xffffffff00000000;
        }
        UNLOCK();
        cVar9 = bVar11 * '\x03';
      }
    } while (cVar9 == '\0');
    if (cVar9 == '\x03') {
      LOCK();
      psVar1 = &arena->used;
      sVar2 = *psVar1;
      *psVar1 = *psVar1 + (ulong)arena->slab_size;
      UNLOCK();
      uVar10 = (ulong)arena->slab_size;
      if (arena->prealloc < sVar2 + uVar10) {
        unaff_R14 = (ulong *)mmap_checked(uVar10,uVar10,arena->flags);
        if (unaff_R14 == (ulong *)0x0) {
          LOCK();
          arena->used = arena->used - (ulong)arena->slab_size;
          UNLOCK();
          uVar3 = arena->slab_size;
          if ((ulong)uVar3 == 0) {
            __assert_fail("size_in_units",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                          ,0xa5,"ssize_t quota_release(struct quota *, size_t)");
          }
          pqVar5 = arena->quota;
          do {
            uVar10 = pqVar5->value;
            uVar7 = (uint)((ulong)uVar3 + 0x3ff >> 10);
            if ((uint)uVar10 < uVar7) {
              __assert_fail("size_in_units <= used_in_units",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                            ,0xab,"ssize_t quota_release(struct quota *, size_t)");
            }
            LOCK();
            bVar11 = uVar10 == pqVar5->value;
            if (bVar11) {
              pqVar5->value = (ulong)((uint)uVar10 - uVar7) | uVar10 & 0xffffffff00000000;
            }
            UNLOCK();
          } while (!bVar11);
        }
        madvise_checked(unaff_R14,(ulong)arena->slab_size,arena->flags);
      }
      else {
        unaff_R14 = (ulong *)(sVar2 + (long)arena->arena);
      }
    }
    else {
      unaff_R14 = (ulong *)0x0;
    }
  }
  return unaff_R14;
}

Assistant:

void *
slab_map(struct slab_arena *arena)
{
	void *ptr;
	if ((ptr = lf_lifo_pop(&arena->cache))) {
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
		return ptr;
	}

	if (quota_use(arena->quota, arena->slab_size) < 0)
		return NULL;

	/** Need to allocate a new slab. */
	size_t used = pm_atomic_fetch_add(&arena->used, arena->slab_size);
	used += arena->slab_size;
	if (used <= arena->prealloc) {
		ptr = arena->arena + used - arena->slab_size;
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
		return ptr;
	}

	ptr = mmap_checked(arena->slab_size, arena->slab_size,
			   arena->flags);
	if (!ptr) {
		__sync_sub_and_fetch(&arena->used, arena->slab_size);
		quota_release(arena->quota, arena->slab_size);
	}

	madvise_checked(ptr, arena->slab_size, arena->flags);

	VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
	return ptr;
}